

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpMessage.h
# Opt level: O1

string * __thiscall
FIX::HttpMessage::getParameterString_abi_cxx11_(string *__return_storage_ptr__,HttpMessage *this)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  _Base_ptr p_Var3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_78 [2];
  long local_68 [2];
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var3 = (this->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_parameters)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,*(long *)(p_Var3 + 1),
                 (long)&(p_Var3[1]._M_parent)->_M_color + *(long *)(p_Var3 + 1));
      std::__cxx11::string::append((char *)local_78);
      plVar2 = (long *)std::__cxx11::string::_M_append((char *)local_78,*(ulong *)(p_Var3 + 2));
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_48 = *plVar4;
        lStack_40 = plVar2[3];
        local_58 = &local_48;
      }
      else {
        local_48 = *plVar4;
        local_58 = (long *)*plVar2;
      }
      local_50 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58);
      if (local_58 != &local_48) {
        operator_delete(local_58,local_48 + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string getParameterString() const {
    std::string result;
    for (Parameters::const_iterator i = m_parameters.begin(); i != m_parameters.end(); ++i) {
      result += (i == m_parameters.begin()) ? "?" : "&";
      result += i->first + "=" + i->second;
    }
    return result;
  }